

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetOProbabilitiesExactScopes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Oii,Index *oIndex)

{
  pointer pSVar1;
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *pMVar2;
  CPDDiscreteInterface *pCVar3;
  Index IVar4;
  size_type __n;
  ostream *poVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double extraout_XMM0_Qa;
  stringstream errormsg;
  allocator_type local_1e1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1e0;
  long local_1d8;
  long local_1d0;
  value_type_conflict3 local_1b8 [2];
  ostream local_1a8 [376];
  
  pSVar1 = (this->_m_XSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1e0 = Oii;
  if (pSVar1[*oIndex].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      *(pointer *)
       &pSVar1[*oIndex].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl) {
    pMVar2 = this->_m_madp;
    __n = (**(code **)(*(long *)((long)&pMVar2->field_0x0 + *(long *)((long)*pMVar2 + -0x188)) +
                      0xc0))((long)&pMVar2->field_0x0 + *(long *)((long)*pMVar2 + -0x188));
    local_1b8[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,__n,local_1b8,&local_1e1);
    IVar4 = IndividualToJointOiiIndices(this,*oIndex,Aii,Yii,local_1e0);
    if (__n != 0) {
      uVar7 = 0;
      do {
        pCVar3 = (this->_m_O_CPDs).
                 super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[*oIndex];
        (*pCVar3->_vptr_CPDDiscreteInterface[2])(pCVar3,uVar7,(ulong)IVar4);
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = extraout_XMM0_Qa;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 < __n);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Observation Factor ",0x13);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," has a non-null PS SF scope, which was ignored.",0x2f);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar6 = &PTR__E_0059bd80;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_1d8,local_1d0 + local_1d8);
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetOProbabilitiesExactScopes( 
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const vector<Index>& Oii,
                    const Index& oIndex //agentI
                ) const
{
    if(GetXSoI_O(oIndex).size() > 0)
    {
      stringstream errormsg;
      errormsg << "Observation Factor " << oIndex << " has a non-null PS SF scope, which was ignored.";
      throw E(errormsg.str());      
    }
    size_t nrVals = _m_madp->GetNrObservations(oIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointOiiIndices(oIndex, Aii, Yii, Oii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_O_CPDs[oIndex]->Get(valI, iiI);
    }
    return(probs);
}